

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O3

void lyht_free(ly_ht *ht,_func_void_void_ptr *val_free)

{
  int *piVar1;
  uint32_t uVar2;
  uchar *puVar3;
  uchar *puVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (ht != (ly_ht *)0x0) {
    if ((val_free != (_func_void_void_ptr *)0x0) && (uVar6 = (ulong)ht->size, ht->size != 0)) {
      puVar4 = ht->recs;
      uVar5 = (uint)ht->rec_size;
      uVar7 = 0;
      do {
        uVar2 = ht->hlists[uVar7].first;
        if (uVar2 != 0xffffffff) {
          puVar3 = puVar4 + uVar2 * uVar5;
          do {
            (*val_free)(puVar3 + 8);
            piVar1 = (int *)(puVar3 + 4);
            puVar4 = ht->recs;
            uVar5 = (uint)ht->rec_size;
            puVar3 = puVar4 + *piVar1 * (uint)ht->rec_size;
          } while (*piVar1 != -1);
          uVar6 = (ulong)ht->size;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < uVar6);
    }
    free(ht->hlists);
    free(ht->recs);
    free(ht);
    return;
  }
  return;
}

Assistant:

LIBYANG_API_DEF void
lyht_free(struct ly_ht *ht, void (*val_free)(void *val_p))
{
    struct ly_ht_rec *rec;
    uint32_t hlist_idx;
    uint32_t rec_idx;

    if (!ht) {
        return;
    }

    if (val_free) {
        LYHT_ITER_ALL_RECS(ht, hlist_idx, rec_idx, rec) {
            val_free(&rec->val);
        }
    }
    free(ht->hlists);
    free(ht->recs);
    free(ht);
}